

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cc
# Opt level: O0

char * ver_get_version_string(filemgr_magic_t magic)

{
  filemgr_magic_t magic_local;
  char *local_8;
  
  if (magic == 0xdeadcafebeefbeef) {
    local_8 = "ForestDB v1.x format";
  }
  else if (magic == 0xdeadcafebeefc001) {
    local_8 = "ForestDB v1.x format";
  }
  else if (magic == 0xdeadcafebeefc002) {
    local_8 = "ForestDB v2.x format";
  }
  else {
    local_8 = "unknown";
  }
  return local_8;
}

Assistant:

const char* ver_get_version_string(filemgr_magic_t magic) {
    switch (magic) {
    case FILEMGR_MAGIC_000:
        return "ForestDB v1.x format";
    case FILEMGR_MAGIC_001:
        return "ForestDB v1.x format";
    case FILEMGR_MAGIC_002:
        return "ForestDB v2.x format";
    }
    return "unknown";
}